

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

AttributeSpec *
deqp::gls::DrawTestSpec::AttributeSpec::createDefaultAttribute
          (InputType inputType,OutputType outputType,int componentCount)

{
  AttributeSpec *in_RDI;
  
  in_RDI->inputType = INPUTTYPE_LAST;
  in_RDI->outputType = OUTPUTTYPE_LAST;
  in_RDI->storage = STORAGE_LAST;
  in_RDI->usage = USAGE_LAST;
  in_RDI->componentCount = 0;
  in_RDI->offset = 0;
  *(undefined8 *)((long)&in_RDI->offset + 1) = 0;
  in_RDI->instanceDivisor = 0;
  *(undefined4 *)((long)&in_RDI->instanceDivisor + 3) = 0;
  in_RDI->inputType = inputType;
  in_RDI->outputType = outputType;
  in_RDI->componentCount = componentCount;
  in_RDI->instanceDivisor = 0;
  in_RDI->offset = 0;
  in_RDI->stride = 0;
  in_RDI->normalize = false;
  in_RDI->useDefaultAttribute = true;
  return in_RDI;
}

Assistant:

DrawTestSpec::AttributeSpec	DrawTestSpec::AttributeSpec::createDefaultAttribute (InputType inputType, OutputType outputType, int componentCount)
{
	DE_ASSERT(inputType == INPUTTYPE_INT || inputType == INPUTTYPE_UNSIGNED_INT || inputType == INPUTTYPE_FLOAT);
	DE_ASSERT(inputType == INPUTTYPE_FLOAT || componentCount == 4);

	DrawTestSpec::AttributeSpec spec;

	spec.inputType				= inputType;
	spec.outputType				= outputType;
	spec.storage				= DrawTestSpec::STORAGE_LAST;
	spec.usage					= DrawTestSpec::USAGE_LAST;
	spec.componentCount			= componentCount;
	spec.offset					= 0;
	spec.stride					= 0;
	spec.normalize				= 0;
	spec.instanceDivisor		= 0;

	spec.useDefaultAttribute	= true;

	return spec;
}